

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

opj_t2_t * opj_t2_create(opj_image_t *p_image,opj_cp_t *p_cp)

{
  opj_t2_t *poVar1;
  
  poVar1 = (opj_t2_t *)opj_calloc(1,0x10);
  if (poVar1 != (opj_t2_t *)0x0) {
    poVar1->image = p_image;
    poVar1->cp = p_cp;
  }
  return poVar1;
}

Assistant:

opj_t2_t* opj_t2_create(opj_image_t *p_image, opj_cp_t *p_cp)
{
    /* create the t2 structure */
    opj_t2_t *l_t2 = (opj_t2_t*)opj_calloc(1, sizeof(opj_t2_t));
    if (!l_t2) {
        return NULL;
    }

    l_t2->image = p_image;
    l_t2->cp = p_cp;

    return l_t2;
}